

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int f_gc(lua_State *L)

{
  long *plVar1;
  
  plVar1 = (long *)luaL_checkudata(L,1,"FILE*");
  if ((plVar1[1] != 0) && (*plVar1 != 0)) {
    aux_close(L);
  }
  return 0;
}

Assistant:

static int f_gc(lua_State *L) {
    LStream *p = tolstream(L);
    if (!isclosed(p) && p->f != NULL)
        aux_close(L);  /* ignore closed and incompletely open files */
    return 0;
}